

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawWallAddClamp4PalCommand::Execute
          (DrawWallAddClamp4PalCommand *this,DrawerThread *thread)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int i;
  long lVar14;
  uint uVar15;
  uint8_t *puVar16;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puVar16 = (this->super_PalWall4Command)._dest;
  iVar2 = (this->super_PalWall4Command)._fracbits;
  puVar7 = (this->super_PalWall4Command)._srcblend;
  puVar8 = (this->super_PalWall4Command)._destblend;
  local_48 = *(undefined8 *)(this->super_PalWall4Command)._texturefrac;
  uStack_40 = *(undefined8 *)((this->super_PalWall4Command)._texturefrac + 2);
  local_58 = *(undefined8 *)(this->super_PalWall4Command)._iscale;
  uStack_50 = *(undefined8 *)((this->super_PalWall4Command)._iscale + 2);
  iVar9 = DrawerThread::count_for_thread
                    (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,
                     (this->super_PalWall4Command)._count);
  if (0 < iVar9) {
    iVar3 = (this->super_PalWall4Command)._pitch;
    iVar10 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    iVar11 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    iVar4 = thread->num_cores;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      iVar5 = *(int *)((long)&local_58 + lVar14 * 4);
      piVar1 = (int *)((long)&local_48 + lVar14 * 4);
      *piVar1 = *piVar1 + iVar5 * iVar10;
      *(int *)((long)&local_58 + lVar14 * 4) = iVar5 * iVar4;
    }
    puVar16 = puVar16 + iVar11 * iVar3;
    do {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        uVar6 = *(uint *)((long)&local_48 + lVar14 * 4);
        uVar13 = (ulong)(this->super_PalWall4Command)._source[lVar14][uVar6 >> ((byte)iVar2 & 0x3f)]
        ;
        if (uVar13 != 0) {
          uVar15 = puVar8[puVar16[lVar14]] +
                   puVar7[(this->super_PalWall4Command)._colormap[lVar14][uVar13]];
          uVar12 = uVar15 & 0x40100400;
          uVar12 = uVar12 - (uVar12 >> 5) | uVar15 & 0x3e0f83e0 | 0x1f07c1f;
          puVar16[lVar14] = RGB32k.All[uVar12 >> 0xf & uVar12];
        }
        *(uint *)((long)&local_48 + lVar14 * 4) = uVar6 + *(int *)((long)&local_58 + lVar14 * 4);
      }
      puVar16 = puVar16 + iVar4 * iVar3;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

void DrawWallAddClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = fg2rgb[_colormap[i][pix]] + bg2rgb[dest[i]];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += pitch;
		} while (--count);
	}